

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  int lenarray;
  uint8_t uVar1;
  uint uVar2;
  undefined8 in_RAX;
  array_container_t *ac;
  uint16_t *array;
  undefined2 uStack_38;
  char local_36;
  uint8_t typecode_local;
  undefined4 local_34;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  _uStack_38 = (undefined3)in_RAX;
  _uStack_38 = CONCAT13(typecode,_uStack_38);
  ac = (array_container_t *)get_writable_copy_if_shared(c,&typecode_local);
  if (typecode_local == '\x03') {
    run_container_add((run_container_t *)ac,val);
    uVar1 = '\x03';
    goto LAB_00109404;
  }
  if (typecode_local == '\x02') {
    lenarray = ac->cardinality;
    if (((long)lenarray == 0) ||
       ((array = ac->array, lenarray < 0x1000 && (array[(long)lenarray + -1] < val)))) {
      array_container_append(ac,val);
    }
    else {
      _uStack_38 = CONCAT12(0xfff < lenarray,uStack_38);
      _uStack_38 = (ulong)CONCAT24(val,_uStack_38);
      uVar2 = binarySearch(array,lenarray,val);
      if (-1 < (int)uVar2 || local_36 != '\0') {
        uVar1 = '\x02';
        if (-1 < (int)uVar2) goto LAB_00109404;
        ac = (array_container_t *)bitset_container_from_array(ac);
        bitset_container_add((bitset_container_t *)ac,(uint16_t)(_uStack_38 >> 0x20));
        goto LAB_001093c7;
      }
      if (lenarray == ac->capacity) {
        array_container_grow(ac,lenarray + 1,true);
        array = ac->array;
      }
      uVar2 = ~uVar2;
      memmove(array + (ulong)uVar2 + 1,array + uVar2,(long)(int)(lenarray - uVar2) * 2);
      ac->array[uVar2] = val;
      ac->cardinality = ac->cardinality + 1;
    }
    uVar1 = '\x02';
  }
  else {
    if (typecode_local != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x120e,
                    "container_t *container_add(container_t *, uint16_t, uint8_t, uint8_t *)");
    }
    bitset_container_set((bitset_container_t *)ac,val);
LAB_001093c7:
    uVar1 = '\x01';
  }
LAB_00109404:
  *new_typecode = uVar1;
  return ac;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode
){
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t* bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}